

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O1

bool __thiscall level_mesh::search_colinear_path(level_mesh *this,uint32_t v0,uint32_t v1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer p_Var4;
  pointer pbVar5;
  iterator __position;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint local_5c;
  undefined1 local_58 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  uint local_34;
  
  local_40 = (ulong)v0;
  p_Var4 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  fVar14 = p_Var4[local_40].field_0.field_0.x - p_Var4[v1].field_0.field_0.x;
  fVar18 = p_Var4[local_40].field_0.field_0.y - p_Var4[v1].field_0.field_0.y;
  fVar15 = p_Var4[local_40].field_0.field_0.z - p_Var4[v1].field_0.field_0.z;
  local_48 = &this->m_path;
  local_34 = v1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign(local_48,1,&local_34);
  fVar16 = fVar15 * fVar15 + fVar14 * fVar14 + fVar18 * fVar18;
  uVar13 = (ulong)local_34;
  do {
    uVar11 = uVar13;
    p_Var4 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar1 = p_Var4[uVar11].field_0.field_0.x;
    fVar2 = p_Var4[uVar11].field_0.field_0.y;
    fVar3 = p_Var4[uVar11].field_0.field_0.z;
    uVar10 = (ulong)(this->super_xr_mesh_builder).m_vertex_faces.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
    uVar13 = uVar11;
    do {
      if (uVar10 == 0xffffffff) break;
      pbVar5 = (this->super_xr_mesh_builder).m_faces.
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = 3;
      do {
        uVar9 = uVar12;
        if (uVar9 == 0) break;
        uVar12 = uVar9 - 1;
      } while (uVar11 != *(uint *)((long)pbVar5 + (uVar9 - 1) * 4 + uVar10 * 0x40));
      if (uVar9 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_mesh_builder.h"
                      ,0x9a,
                      "uint_fast32_t xray_re::xr_mesh_builder::b_face::local_vert_idx(uint_fast32_t) const"
                     );
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar9;
      uVar12 = (ulong)*(uint *)((long)&pbVar5[uVar10].field_0 +
                               (ulong)(((int)uVar9 +
                                       (SUB164(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 1) * -3) *
                                      4));
      p_Var4 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar19 = p_Var4[uVar12].field_0.field_0.x - fVar1;
      fVar21 = p_Var4[uVar12].field_0.field_0.y - fVar2;
      fVar20 = p_Var4[uVar12].field_0.field_0.z - fVar3;
      fVar17 = (fVar20 * fVar20 + fVar19 * fVar19 + fVar21 * fVar21) * fVar16;
      if (fVar17 < 0.0) {
        local_58 = ZEXT416((uint)fVar20);
        fVar17 = sqrtf(fVar17);
        fVar20 = local_58._0_4_;
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar17 = (fVar20 * fVar15 + fVar19 * fVar14 + fVar21 * fVar18) / fVar17;
      if ((float)(~-(uint)(fVar17 < 1.0) & (uint)(fVar17 + -1.0) |
                 (uint)(1.0 - fVar17) & -(uint)(fVar17 < 1.0)) < 2e-06) {
LAB_0012f670:
        uVar13 = uVar12;
        bVar8 = false;
      }
      else {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar9 + 1;
        uVar12 = (ulong)*(uint *)((long)&pbVar5[uVar10].field_0 +
                                 (ulong)(((int)(uVar9 + 1) +
                                         (SUB164(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) >> 1) * -3)
                                        * 4));
        p_Var4 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar19 = p_Var4[uVar12].field_0.field_0.x - fVar1;
        fVar21 = p_Var4[uVar12].field_0.field_0.y - fVar2;
        fVar20 = p_Var4[uVar12].field_0.field_0.z - fVar3;
        fVar17 = (fVar20 * fVar20 + fVar19 * fVar19 + fVar21 * fVar21) * fVar16;
        if (fVar17 < 0.0) {
          local_58 = ZEXT416((uint)fVar20);
          fVar17 = sqrtf(fVar17);
          fVar20 = local_58._0_4_;
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        fVar17 = (fVar20 * fVar15 + fVar19 * fVar14 + fVar21 * fVar18) / fVar17;
        if ((float)(~-(uint)(fVar17 < 1.0) & (uint)(fVar17 + -1.0) |
                   (uint)(1.0 - fVar17) & -(uint)(fVar17 < 1.0)) < 2e-06) goto LAB_0012f670;
        uVar10 = (ulong)*(uint *)((long)&pbVar5[uVar10].field_0 + uVar9 * 4 + 0x20);
        bVar8 = true;
      }
    } while (bVar8);
    if (uVar13 == uVar11) break;
    local_5c = (uint)uVar13;
    __position._M_current =
         (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (local_48,__position,&local_5c);
    }
    else {
      *__position._M_current = local_5c;
      (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  } while (uVar13 != local_40);
  return uVar13 != uVar11;
}

Assistant:

bool level_mesh::search_colinear_path(uint32_t v0, uint32_t v1)
{
	fvector3 px, span;
	span.sub(m_points[v0], m_points[v1]);

	m_path.assign(1, v1);
	for (uint_fast32_t vx = v1, vm;; vx = vm) {
		px.set(m_points[vm = vx]);
		for (uint_fast32_t next = m_vertex_faces[vx]; next != BAD_IDX;) {
			const b_face& face = m_faces[next];
			uint_fast32_t ix = face.local_vert_idx(vx), vt;
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 1)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 2)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			next = face.link[ix];
		}
		if (vm == vx)
			return false;
		m_path.push_back(uint32_t(vm & UINT32_MAX));
		if (vm == v0)
			return true;
	}
	return false;
}